

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stepper.cpp
# Opt level: O0

Button __thiscall QtMWidgets::StepperPrivate::buttonPressed(StepperPrivate *this,QPoint *pos)

{
  int iVar1;
  int iVar2;
  ulong uVar3;
  undefined1 local_40 [8];
  QRect plus;
  QRect minus;
  QPoint *pos_local;
  StepperPrivate *this_local;
  
  join_0x00000010_0x00000000_ = QWidget::rect(&this->q->super_QWidget);
  iVar1 = QRect::left((QRect *)&plus.x2);
  iVar2 = QRect::width((QRect *)&plus.x2);
  QRect::setRight((QRect *)&plus.x2,iVar1 + iVar2 / 2 + -1);
  _local_40 = QWidget::rect(&this->q->super_QWidget);
  iVar1 = QRect::right((QRect *)&plus.x2);
  QRect::setLeft((QRect *)local_40,iVar1 + 1);
  uVar3 = QRect::contains((QPoint *)&plus.x2,SUB81(pos,0));
  if ((uVar3 & 1) == 0) {
    uVar3 = QRect::contains((QPoint *)local_40,SUB81(pos,0));
    if ((uVar3 & 1) == 0) {
      this_local._4_4_ = NoButton;
    }
    else {
      this_local._4_4_ = Plus;
    }
  }
  else {
    this_local._4_4_ = Minus;
  }
  return this_local._4_4_;
}

Assistant:

StepperPrivate::Button
StepperPrivate::buttonPressed( const QPoint & pos )
{
	QRect minus = q->rect();
	minus.setRight( minus.left() + minus.width() / 2 - 1 );
	QRect plus = q->rect();
	plus.setLeft( minus.right() + 1 );

	if( minus.contains( pos ) )
		return Minus;
	else if( plus.contains( pos ) )
		return Plus;
	else
		return NoButton;
}